

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

bool __thiscall FMultiBlockLinesIterator::GoDown(FMultiBlockLinesIterator *this,double x,double y)

{
  bool bVar1;
  
  if (this->continuedown == true) {
    bVar1 = (this->cursector->planes[0].Flags & 0x1d0U) != 0x100;
    if (bVar1) {
      this->continuedown = false;
    }
    else {
      startIteratorForGroup
                (this,(sectorPortals.Array[this->cursector->Portals[0]].mDestination)->PortalGroup);
      this->portalflags = 0x40;
    }
    return !bVar1;
  }
  return false;
}

Assistant:

bool FMultiBlockLinesIterator::GoDown(double x, double y)
{
	if (continuedown)
	{
		if (!cursector->PortalBlocksMovement(sector_t::floor))
		{
			startIteratorForGroup(cursector->GetOppositePortalGroup(sector_t::floor));
			portalflags = FFCF_NOCEILING;
			return true;
		}
		else continuedown = false;
	}
	return false;
}